

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O2

_Bool test_next_bits_iterate(void)

{
  bitset_t *bitset;
  undefined8 uVar1;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  int i;
  size_t sVar5;
  ulong uVar6;
  size_t local_50;
  size_t buffer [3];
  
  bitset = bitset_create();
  for (sVar5 = 0; sVar5 != 100; sVar5 = sVar5 + 1) {
    bitset_set(bitset,sVar5);
  }
  for (uVar6 = 1000; uVar6 < 0x44c; uVar6 = uVar6 + 2) {
    bitset_set(bitset,uVar6);
  }
  local_50 = 0;
  lVar4 = 0;
  do {
    sVar5 = bitset_next_set_bits(bitset,buffer,3,&local_50);
    if (sVar5 == 0) {
      if (lVar4 == 0x96) {
        bitset_free(bitset);
        return true;
      }
      uVar1 = 0x11d;
LAB_00101f67:
      fprintf(_stderr,"Assertion failed in %s at line %d\n","test_next_bits_iterate",uVar1);
      exit(1);
    }
    uVar6 = lVar4 * 2 + 800;
    for (sVar2 = 0; sVar5 != sVar2; sVar2 = sVar2 + 1) {
      uVar3 = sVar2 + lVar4;
      if (99 < sVar2 + lVar4) {
        uVar3 = uVar6;
      }
      if (buffer[sVar2] != uVar3) {
        uVar1 = 0x119;
        goto LAB_00101f67;
      }
      uVar6 = uVar6 + 2;
    }
    local_50 = local_50 + 1;
    lVar4 = sVar5 + lVar4;
  } while( true );
}

Assistant:

bool test_next_bits_iterate() {
  bitset_t *b = bitset_create();
  for (int i = 0; i < 100; i++)
    bitset_set(b, i);
  for (int i = 1000; i < 1100; i += 2)
    bitset_set(b, i);

  size_t buffer[3];
  size_t howmany = 0;
  size_t i = 0;
  for (size_t startfrom = 0;
       (howmany = bitset_next_set_bits(
            b, buffer, sizeof(buffer) / sizeof(buffer[0]), &startfrom)) > 0;
       startfrom++) {
    for (size_t j = 0; j < howmany; j++) {
      size_t expected;
      if (i < 100) {
        expected = i;
      } else {
        expected = 1000 + 2 * (i - 100);
      }
      TEST_ASSERT(buffer[j] == expected);
      ++i;
    }
  }
  TEST_ASSERT(i == 150);
  bitset_free(b);
  return true;
}